

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

s_level * get_first_elemental_plane(void)

{
  s_level *psVar1;
  s_level *dummy;
  s_level *curr;
  
  psVar1 = find_level("dummy");
  dummy = find_level("astral");
  while( true ) {
    if (dummy == (s_level *)0x0) {
      return (s_level *)0x0;
    }
    if (dummy->next == psVar1) break;
    dummy = dummy->next;
  }
  return dummy;
}

Assistant:

s_level *get_first_elemental_plane(void)
{
	s_level *curr,
		*dummy = find_level("dummy");
	for (curr = find_level("astral"); curr; curr = curr->next) {
	    if (curr->next == dummy)
		return curr;
	}
	return NULL;
}